

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_watershield(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  uint uVar2;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,(int)gsn_watershield);
  if (bVar1) {
    send_to_char("You are already surrounded by a shield of water.\n\r",ch);
    return;
  }
  init_affect(&AStack_88);
  AStack_88.where = 0;
  AStack_88.aftype = 0;
  AStack_88.type = gsn_watershield;
  AStack_88.level = (short)level;
  uVar2 = level + 3;
  if (-1 < level) {
    uVar2 = level;
  }
  AStack_88.duration = (short)(uVar2 >> 2);
  AStack_88.location = 0;
  AStack_88.modifier = 0;
  AStack_88.mod_name = 8;
  affect_to_char(ch,&AStack_88);
  send_to_char("You form a shield of swirling water around you.\n\r",ch);
  act("A magical sphere of swirling water briefly surrounds $n.",ch,(void *)0x0,(void *)0x0,0);
  return;
}

Assistant:

void spell_watershield(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_watershield))
	{
		send_to_char("You are already surrounded by a shield of water.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_watershield;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 4;
	af.location = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("You form a shield of swirling water around you.\n\r", ch);
	act("A magical sphere of swirling water briefly surrounds $n.", ch, 0, 0, TO_ROOM);
}